

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall gss::innards::Proof::initial_domain_is_empty(Proof *this,int p,string *where)

{
  type pbVar1;
  ostream *poVar2;
  string *in_RDX;
  int in_ESI;
  undefined4 in_stack_fffffffffffffff0;
  
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x184a7b);
  pbVar1 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  poVar2 = std::operator<<(pbVar1,"* failure due to domain ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
  poVar2 = std::operator<<(poVar2," being empty at ");
  poVar2 = std::operator<<(poVar2,in_RDX);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

auto Proof::initial_domain_is_empty(int p, const string & where) -> void
{
    *_imp->proof_stream << "* failure due to domain " << p << " being empty at " << where << '\n';
}